

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport.c
# Opt level: O2

IOTHUB_CLIENT_RESULT
IoTHubTransport_StartWorkerThread
          (TRANSPORT_HANDLE transportHandle,IOTHUB_CLIENT_CORE_HANDLE clientHandle,
          IOTHUB_CLIENT_MULTIPLEXED_DO_WORK muxDoWork)

{
  THREAD_HANDLE *threadHandle;
  bool bVar1;
  LOCK_RESULT LVar2;
  int iVar3;
  THREADAPI_RESULT TVar4;
  size_t sVar5;
  void *pvVar6;
  LOGGER_LOG p_Var7;
  IOTHUB_CLIENT_RESULT IVar8;
  IOTHUB_CLIENT_CORE_HANDLE local_28;
  
  if (clientHandle == (IOTHUB_CLIENT_CORE_HANDLE)0x0 || transportHandle == (TRANSPORT_HANDLE)0x0) {
    return IOTHUB_CLIENT_INVALID_ARG;
  }
  if (transportHandle->clientDoWork == (IOTHUB_CLIENT_MULTIPLEXED_DO_WORK)0x0) {
    transportHandle->clientDoWork = muxDoWork;
  }
  local_28 = clientHandle;
  if (transportHandle->workerThreadHandle == (THREAD_HANDLE)0x0) {
    threadHandle = &transportHandle->workerThreadHandle;
    transportHandle->stopThread = 0;
    TVar4 = ThreadAPI_Create(threadHandle,transport_worker_thread,transportHandle);
    if (TVar4 == THREADAPI_OK) {
      if (*threadHandle != (THREAD_HANDLE)0x0) goto LAB_00127979;
    }
    else {
      *threadHandle = (THREAD_HANDLE)0x0;
    }
  }
  else {
LAB_00127979:
    LVar2 = Lock(transportHandle->clientsLockHandle);
    if (LVar2 == LOCK_OK) {
      sVar5 = VECTOR_size(transportHandle->clients);
      if (((sVar5 == 0) ||
          (pvVar6 = VECTOR_find_if(transportHandle->clients,find_by_handle,clientHandle),
          pvVar6 == (void *)0x0)) &&
         (iVar3 = VECTOR_push_back(transportHandle->clients,&local_28,1), iVar3 != 0)) {
        p_Var7 = xlogging_get_log_function();
        IVar8 = IOTHUB_CLIENT_ERROR;
        if (p_Var7 == (LOGGER_LOG)0x0) {
          bVar1 = false;
        }
        else {
          bVar1 = false;
          (*p_Var7)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                    ,"start_worker_if_needed",0xe5,1,
                    "Failed adding device to list (VECTOR_push_back failed)");
        }
      }
      else {
        IVar8 = IOTHUB_CLIENT_OK;
        bVar1 = true;
      }
      LVar2 = Unlock(transportHandle->clientsLockHandle);
      if ((LVar2 != LOCK_OK) && (p_Var7 = xlogging_get_log_function(), p_Var7 != (LOGGER_LOG)0x0)) {
        (*p_Var7)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                  ,"start_worker_if_needed",0xf4,1,"failed to unlock on start_worker_if_needed");
      }
      if (bVar1) {
        return IOTHUB_CLIENT_OK;
      }
      goto LAB_00127ad4;
    }
    p_Var7 = xlogging_get_log_function();
    if (p_Var7 != (LOGGER_LOG)0x0) {
      (*p_Var7)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                ,"start_worker_if_needed",0xdb,1,"failed to lock for start_worker_if_needed");
    }
  }
  IVar8 = IOTHUB_CLIENT_ERROR;
LAB_00127ad4:
  p_Var7 = xlogging_get_log_function();
  if (p_Var7 != (LOGGER_LOG)0x0) {
    (*p_Var7)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
              ,"IoTHubTransport_StartWorkerThread",0x188,1,"Unable to start thread safely");
  }
  return IVar8;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubTransport_StartWorkerThread(TRANSPORT_HANDLE transportHandle, IOTHUB_CLIENT_CORE_HANDLE clientHandle, IOTHUB_CLIENT_MULTIPLEXED_DO_WORK muxDoWork)
{
    IOTHUB_CLIENT_RESULT result;
    if (transportHandle == NULL || clientHandle == NULL)
    {
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        TRANSPORT_HANDLE_DATA * transportData = (TRANSPORT_HANDLE_DATA*)transportHandle;

        if (transportData->clientDoWork == NULL)
        {
            transportData->clientDoWork = muxDoWork;
        }

        if ((result = start_worker_if_needed(transportData, clientHandle)) != IOTHUB_CLIENT_OK)
        {
            LogError("Unable to start thread safely");
        }
        else
        {
            result = IOTHUB_CLIENT_OK;
        }
    }
    return result;
}